

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O1

bool __thiscall Min2<0>::check(Min2<0> *this)

{
  int iVar1;
  int iVar2;
  IntVar *pIVar3;
  IntVar *pIVar4;
  
  pIVar3 = (this->x).var;
  pIVar4 = (this->y).var;
  iVar1 = (&pIVar3->min)[(ulong)pIVar3->in_scip * 4].v;
  iVar2 = (&pIVar4->min)[(ulong)pIVar4->in_scip * 4].v;
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  pIVar3 = (this->z).var;
  return iVar1 == (&pIVar3->min)[(ulong)pIVar3->in_scip * 4].v;
}

Assistant:

int64_t getShadowVal() const {
		int64_t v = (type & 1) != 0 ? -var->getShadowVal() : var->getShadowVal();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}